

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::PickerPrivate::drawItem
          (PickerPrivate *this,QPainter *p,QStyleOption *opt,int offset,QModelIndex *index)

{
  bool bVar1;
  ItemFlags IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QColor *c;
  int iVar6;
  PickerPrivate *this_00;
  QColor QVar7;
  QRect tickRect;
  QArrayDataPointer<char16_t> local_58;
  QRect r;
  
  IVar2 = QModelIndex::flags(index);
  if ((IVar2.i & 0x20) == 0) {
    c = QPalette::color((QPalette *)(opt + 0x28),WindowText);
    QVar7 = lighterColor(c,0x4b);
    tickRect._0_8_ = QVar7._0_8_;
    tickRect.x2 = QVar7.ct._4_4_;
    tickRect.y2 = CONCAT22(tickRect.y2._2_2_,QVar7.ct._8_2_);
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&tickRect,&this->currentIndex);
    bVar1 = QModelIndex::operator!=(index,(QModelIndex *)&tickRect);
    if (bVar1) {
      QPalette::color((QPalette *)(opt + 0x28),WindowText);
    }
  }
  QPainter::setPen((QColor *)p);
  iVar5 = this->itemSideMargin;
  r.x1 = *(int *)(opt + 0x10) + iVar5;
  r.y2 = this->stringHeight + offset + -1;
  r.x2 = *(int *)(opt + 0x18) + iVar5 + iVar5 * -2;
  r.y1 = offset;
  itemText((QString *)&local_58,this,index);
  accomodateString((QString *)&tickRect,(QString *)&local_58,&r,0x101,opt);
  QPainter::drawText((QRect *)p,(int)&r,(QString *)0x101,&tickRect);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tickRect);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  IVar2 = QModelIndex::flags(index);
  if ((IVar2.i & 0x20) != 0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&tickRect,&this->currentIndex);
    bVar1 = QModelIndex::operator==(index,(QModelIndex *)&tickRect);
    if (bVar1) {
      iVar5 = this->itemSideMargin;
      iVar6 = *(int *)(opt + 0x10);
      this_00 = (PickerPrivate *)(opt + 0x20);
      iVar3 = QFontMetrics::averageCharWidth();
      iVar4 = QFontMetrics::averageCharWidth();
      iVar6 = iVar4 / -2 + ((iVar5 + iVar6) - iVar3);
      iVar5 = QFontMetrics::averageCharWidth();
      tickRect.y2 = offset + -1 + this->stringHeight;
      tickRect.y1 = offset;
      tickRect.x1 = iVar6;
      tickRect.x2 = iVar5 + -1 + iVar6;
      drawTick(this_00,&tickRect,p);
    }
  }
  return;
}

Assistant:

void
PickerPrivate::drawItem( QPainter * p, const QStyleOption & opt, int offset,
	const QModelIndex & index )
{
	if( index.flags() & Qt::ItemIsEnabled )
	{
		if( index != currentIndex )
			p->setPen( opt.palette.color( QPalette::WindowText ) );
		else
			p->setPen( highlightColor );
	}
	else
		p->setPen( lighterColor( opt.palette.color( QPalette::WindowText ), 75 ) );

	const QRect r( opt.rect.x() + itemSideMargin, offset,
		opt.rect.width() - itemSideMargin * 2, stringHeight );

	const int flags = Qt::AlignLeft | Qt::TextSingleLine;

	p->drawText( r, flags,
		makeString( itemText( index ), r, flags, opt ) );

	if( index.flags() & Qt::ItemIsEnabled && index == currentIndex )
	{
		const QRect tickRect( opt.rect.x() + itemSideMargin -
				opt.fontMetrics.averageCharWidth() -
				opt.fontMetrics.averageCharWidth() / 2,
			offset,
			opt.fontMetrics.averageCharWidth(),
			stringHeight );

		drawTick( tickRect, p );
	}
}